

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

size_t derSIDDec(char *oid,u32 val)

{
  size_t sVar1;
  u32 t;
  size_t pos;
  size_t count;
  u32 val_local;
  char *oid_local;
  
  count = 0;
  t = val;
  sVar1 = count;
  do {
    count = sVar1;
    t = t / 10;
    sVar1 = count + 1;
  } while (t != 0);
  if (oid != (char *)0x0) {
    oid[count] = (char)(val % 10) + '0';
    t = val;
    pos = count;
    while (pos != 0) {
      t = t / 10;
      oid[pos - 1] = (char)(t % 10) + '0';
      pos = pos - 1;
    }
  }
  return count + 1;
}

Assistant:

static size_t derSIDDec(char* oid, u32 val)
{
	size_t count = 0, pos;
	u32 t = val;
	// число символов для val
	do
		t /= 10, count++;
	while (t > 0);
	// декодирование
	if (oid)
	{
		ASSERT(memIsValid(oid, count));
		pos = count - 1;
		oid[pos] = (t = val) % 10 + '0';
		while (pos--)
			t /= 10, oid[pos] = t % 10 + '0';
	}
	return count;
}